

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O3

bool ON_Internal_UseSubDMeshProxy(ON_BinaryArchive *archive)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 == 0x3c) {
    uVar2 = ON::VersionMajor();
    bVar3 = uVar2 < 6;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool ON_Internal_UseSubDMeshProxy(
  const ON_BinaryArchive& archive
)
{
  if (archive.Archive3dmVersion() != 60)
  {
    return false; // subd mesh proxy only applies when reading or writing a V6 files.
  }

  // In a WIP, used subd objects.
  const unsigned int min_subd_version =
#if defined(RHINO_COMMERCIAL_BUILD)
    // Sep 5 2017 Dale Lear RH-41113
    // Rhino 6 commercial will have SubD objects.
    // Nope. -> V6 commercial builds do not have subd objects - use proxy mesh when version < 7.
    // 7 
    6 
#else
    // V6 WIP builds and all V7 and later builds have subd objects.
    // Use proxy mesh when version < 6.
    6
#endif
    ;
  return (ON::VersionMajor() < min_subd_version);
}